

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken
          (sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_analysisAndEvaluationEnvironment_t *environmentObject;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_environment_isAnalysisAndEvaluationEnvironment(context,environment);
  if (!_Var1) {
    sysbvm_error("Expected an analysis and evaluation environment.");
  }
  if (*(long *)(environment + 0x50) == 0) {
    sVar2 = sysbvm_analyzerToken_create(context);
    *(sysbvm_tuple_t *)(environment + 0x50) = sVar2;
  }
  return *(sysbvm_tuple_t *)(environment + 0x50);
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        sysbvm_error("Expected an analysis and evaluation environment.");

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    if(!environmentObject->analyzerToken)
        environmentObject->analyzerToken = sysbvm_analyzerToken_create(context);
    return environmentObject->analyzerToken;
}